

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Message testing::internal::UnorderedElementsAreMatcherImplBase::Elements(size_t n)

{
  Message *in_RSI;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDI;
  char (*in_stack_ffffffffffffff98) [9];
  Message *in_stack_ffffffffffffffa0;
  Message *in_stack_ffffffffffffffd0;
  Message *in_stack_ffffffffffffffe8;
  
  Message::Message(in_stack_ffffffffffffffd0);
  Message::operator<<(in_stack_ffffffffffffffa0,(unsigned_long *)in_stack_ffffffffffffff98);
  Message::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  Message::operator<<(in_stack_ffffffffffffffa0,(char **)in_stack_ffffffffffffff98);
  Message::Message(in_RSI,in_stack_ffffffffffffffe8);
  Message::~Message((Message *)0x151ea9);
  return (Message)(scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   )in_RDI.ptr_;
}

Assistant:

static Message Elements(size_t n) {
    return Message() << n << " element" << (n == 1 ? "" : "s");
  }